

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

HighsInt __thiscall
free_format_parser::HMpsFF::fillHessian(HMpsFF *this,HighsLogOptions *log_options)

{
  int iVar1;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> *p_Var2;
  reference pvVar3;
  __tuple_element_t<0UL,_tuple<int,_int,_double>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<int,_int,_double>_> *p_Var5;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar6;
  long in_RDI;
  double value;
  HighsInt iCol_2;
  HighsInt iRow;
  size_t iEl_1;
  HighsInt iCol_1;
  HighsInt iCol;
  size_t iEl;
  vector<int,_std::allocator<int>_> q_length;
  size_t num_entries;
  size_type in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  __tuple_element_t<0UL,_tuple<int,_int,_double>_> _Var7;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_type local_68;
  int local_60;
  size_type local_58;
  vector<int,_std::allocator<int>_> local_38;
  size_type local_20;
  HighsInt local_4;
  
  local_20 = std::
             vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
             size((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                   *)(in_RDI + 0x2d0));
  if (local_20 == 0) {
    *(undefined4 *)(in_RDI + 0x160) = 0;
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(in_RDI + 0x1c);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x45d7d3);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,(value_type_conflict2 *)0x45d7f6);
    for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
      std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
      operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)(in_RDI + 0x2d0),local_58);
      p_Var2 = std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x45d82e);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)*p_Var2);
      *pvVar3 = *pvVar3 + 1;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),0);
    *pvVar3 = 0;
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x1c); local_60 = local_60 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_60);
      vVar8 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_60);
      iVar1 = vVar8 + *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)(local_60 + 1)
                         );
      *pvVar3 = iVar1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_60);
      vVar8 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_60);
      *pvVar3 = vVar8;
    }
    for (local_68 = 0; local_68 < local_20; local_68 = local_68 + 1) {
      std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
      operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)(in_RDI + 0x2d0),local_68);
      p_Var4 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x45d98c);
      _Var7 = *p_Var4;
      std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
      operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)(in_RDI + 0x2d0),local_68);
      p_Var2 = std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x45d9b0);
      iVar1 = *p_Var2;
      std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
      operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)(in_RDI + 0x2d0),local_68);
      p_Var5 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x45d9d4);
      in_stack_ffffffffffffff60 = (vector<int,_std::allocator<int>_> *)*p_Var5;
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x180);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)iVar1);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar3);
      *pvVar3 = _Var7;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)iVar1);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x198),(long)*pvVar3)
      ;
      *pvVar6 = (value_type)in_stack_ffffffffffffff60;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)iVar1);
      *pvVar3 = *pvVar3 + 1;
    }
    local_4 = 0;
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  }
  return local_4;
}

Assistant:

HighsInt HMpsFF::fillHessian(const HighsLogOptions& log_options) {
  size_t num_entries = q_entries.size();
  if (!num_entries) {
    q_dim = 0;
    return 0;
  } else {
    q_dim = num_col;
  }

  q_start.resize(q_dim + 1);
  q_index.resize(num_entries);
  q_value.resize(num_entries);

  // Use q_length to determine the number of entries in each column,
  // and then as workspace to point to the next entry to be filled in
  // each column
  std::vector<HighsInt> q_length;
  q_length.assign(q_dim, 0);

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    q_length[iCol]++;
  }
  q_start[0] = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    q_start[iCol + 1] = q_start[iCol] + q_length[iCol];
    q_length[iCol] = q_start[iCol];
  }

  for (size_t iEl = 0; iEl < num_entries; iEl++) {
    HighsInt iRow = std::get<0>(q_entries[iEl]);
    HighsInt iCol = std::get<1>(q_entries[iEl]);
    double value = std::get<2>(q_entries[iEl]);
    q_index[q_length[iCol]] = iRow;
    q_value[q_length[iCol]] = value;
    q_length[iCol]++;
  }
  return 0;
}